

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO_Report_PDU.cpp
# Opt level: O2

KBOOL __thiscall KDIS::PDU::IO_Report_PDU::operator==(IO_Report_PDU *this,IO_Report_PDU *Value)

{
  KBOOL KVar1;
  
  KVar1 = IO_Header::operator!=(&this->super_IO_Header,&Value->super_IO_Header);
  if ((((!KVar1) && (this->m_ui16SimSrc == Value->m_ui16SimSrc)) &&
      (this->m_ui8RptTyp == Value->m_ui8RptTyp)) &&
     ((KVar1 = DATA_TYPE::EntityIdentifier::operator!=(&this->m_AtkEntityID,&Value->m_AtkEntityID),
      !KVar1 && (KVar1 = DATA_TYPE::EntityIdentifier::operator!=
                                   (&this->m_TgtEntityID,&Value->m_TgtEntityID), !KVar1)))) {
    return this->m_ui16NumStdVarRec == Value->m_ui16NumStdVarRec;
  }
  return false;
}

Assistant:

KBOOL IO_Report_PDU::operator == ( const IO_Report_PDU & Value ) const
{
    if( IO_Header::operator !=( Value ) )                 return false;
    if( m_ui16SimSrc        != Value.m_ui16SimSrc )       return false;
    if( m_ui8RptTyp         != Value.m_ui8RptTyp )        return false;
    if( m_AtkEntityID       != Value.m_AtkEntityID )      return false;
    if( m_TgtEntityID       != Value.m_TgtEntityID )      return false;
    if( m_ui16NumStdVarRec  != Value.m_ui16NumStdVarRec ) return false;
    return true;
}